

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

void tinyexr::hufPackEncTable(longlong *hcode,int im,int iM,char **pcode)

{
  ulong *puVar1;
  ulong bits;
  char *pcVar2;
  uint uVar3;
  int nBits;
  ulong uVar4;
  int lc;
  longlong c;
  char *p;
  char **local_38;
  
  p = *pcode;
  c = 0;
  lc = 0;
  local_38 = pcode;
  do {
    if (iM < im) {
      pcVar2 = p;
      if (0 < lc) {
        pcVar2 = p + 1;
        *p = (char)(c << (8U - (char)lc & 0x3f));
      }
      *local_38 = pcVar2;
      return;
    }
    uVar4 = (ulong)im;
    puVar1 = (ulong *)(hcode + uVar4);
    if ((*puVar1 & 0x3f) == 0) {
      bits = 0x3a;
      uVar3 = 1;
      while ((((long)uVar4 < (long)iM && (uVar3 < 0x105)) &&
             ((*(byte *)(hcode + uVar4 + 1) & 0x3f) == 0))) {
        uVar3 = uVar3 + 1;
        uVar4 = uVar4 + 1;
        bits = bits + 1;
      }
      if (uVar3 < 2) {
        im = (int)uVar4;
        goto LAB_0012068a;
      }
      nBits = 6;
      if (5 < uVar3) {
        outputBits(6,0x3f,&c,&lc,&p);
        bits = (ulong)(uVar3 - 6);
        nBits = 8;
      }
      outputBits(nBits,bits,&c,&lc,&p);
    }
    else {
LAB_0012068a:
      outputBits(6,*puVar1 & 0x3f,&c,&lc,&p);
      uVar4 = (ulong)(uint)im;
    }
    im = (int)uVar4 + 1;
  } while( true );
}

Assistant:

void hufPackEncTable(
    const long long *hcode,  // i : encoding table [HUF_ENCSIZE]
    int im,                  // i : min hcode index
    int iM,                  // i : max hcode index
    char **pcode)            //  o: ptr to packed table (updated)
{
  char *p = *pcode;
  long long c = 0;
  int lc = 0;

  for (; im <= iM; im++) {
    int l = hufLength(hcode[im]);

    if (l == 0) {
      int zerun = 1;

      while ((im < iM) && (zerun < LONGEST_LONG_RUN)) {
        if (hufLength(hcode[im + 1]) > 0) break;
        im++;
        zerun++;
      }

      if (zerun >= 2) {
        if (zerun >= SHORTEST_LONG_RUN) {
          outputBits(6, LONG_ZEROCODE_RUN, c, lc, p);
          outputBits(8, zerun - SHORTEST_LONG_RUN, c, lc, p);
        } else {
          outputBits(6, SHORT_ZEROCODE_RUN + zerun - 2, c, lc, p);
        }
        continue;
      }
    }

    outputBits(6, l, c, lc, p);
  }

  if (lc > 0) *p++ = (unsigned char)(c << (8 - lc));

  *pcode = p;
}